

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O0

TemplateDecls * __thiscall
pfederc::Parser::parseTemplateDecl(TemplateDecls *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  bool bVar2;
  type pEVar3;
  long lVar4;
  Token *this_00;
  bool local_d1;
  undefined1 local_b0 [24];
  unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> *local_98;
  __normal_iterator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_*,_std::vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>_>
  local_90;
  const_iterator local_88;
  undefined1 local_80 [8];
  unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> templdecl;
  __normal_iterator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_*,_std::vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>_>
  local_68;
  const_iterator local_60;
  undefined1 local_58 [8];
  unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> templdecl_1;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> rhs;
  BiOpExpr *biopexpr;
  TemplateDecls result;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  bool err;
  Parser *this_local;
  
  sanityExpect(this,TOK_OP_TEMPL_BRACKET_OPEN);
  bVar1 = false;
  parseExpression((Parser *)
                  &result.
                   super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(Precedence)this);
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
            *)&biopexpr);
  while( true ) {
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)
                       &result.
                        super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_d1 = false;
    if (bVar2) {
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &result.
                           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_d1 = isBiOpExpr(pEVar3,TOK_OP_COMMA);
    }
    if (local_d1 == false) break;
    pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                        &result.
                         super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lVar4 = __dynamic_cast(pEVar3,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
    if (lVar4 == 0) {
      __cxa_bad_cast();
    }
    BiOpExpr::getRightPtr((BiOpExpr *)&templdecl_1);
    fromExprToTemplateDecl
              ((Parser *)local_58,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_58);
    if (bVar2) {
      local_68._M_current =
           (unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> *)
           std::
           vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           ::begin((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                    *)&biopexpr);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>const*,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>>
      ::
      __normal_iterator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>*>
                ((__normal_iterator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>const*,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>>
                  *)&local_60,&local_68);
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::insert((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                *)&biopexpr,local_60,(value_type *)local_58);
    }
    else {
      bVar1 = true;
    }
    BiOpExpr::getLeftPtr((BiOpExpr *)&templdecl);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               &result.
                super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&templdecl);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&templdecl);
    std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>::~unique_ptr
              ((unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> *)
               local_58);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&templdecl_1);
  }
  fromExprToTemplateDecl
            ((Parser *)local_80,
             (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_80);
  if (bVar2) {
    local_90._M_current =
         (unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> *)
         std::
         vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
         ::begin((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                  *)&biopexpr);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>const*,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>>
    ::
    __normal_iterator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>*>
              ((__normal_iterator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>const*,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>>
                *)&local_88,&local_90);
    local_98 = (unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> *)
               std::
               vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
               ::insert((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                         *)&biopexpr,local_88,(value_type *)local_80);
  }
  else {
    bVar1 = true;
  }
  bVar2 = expect(this,TOK_TEMPL_BRACKET_CLOSE);
  if (!bVar2) {
    local_b0._6_2_ = 2;
    local_b0._0_4_ = 3;
    this_00 = Lexer::getCurrentToken(this->lexer);
    Token::getPosition(this_00);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_b0 + 8),(SyntaxErrorCode *)(local_b0 + 6),(Position *)local_b0);
    generateError((Parser *)(local_b0 + 0x10),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_b0 + 0x10));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_b0 + 8));
    bVar1 = true;
  }
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
              *)&biopexpr);
  }
  std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>::~unique_ptr
            ((unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> *)
             local_80);
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             *)&biopexpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
             &result.
              super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

TemplateDecls Parser::parseTemplateDecl() noexcept {
  sanityExpect(TokenType::TOK_OP_TEMPL_BRACKET_OPEN);

  bool err = false;

  std::unique_ptr<Expr> expr(parseExpression());
  TemplateDecls result;

  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    std::unique_ptr<Expr> rhs(biopexpr.getRightPtr());

    std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(rhs)));
    if (!templdecl)
      err = true;
    else
      // success, push on result
      result.insert(result.begin(), std::move(templdecl));

    // next iterator step
    expr = biopexpr.getLeftPtr();
  }
  
  std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(expr)));
  if (!templdecl)
    err = true;
  // success, push on result
  else
    result.insert(result.begin(), std::move(templdecl));

  if (!expect(TokenType::TOK_TEMPL_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET,
          lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (err)
    return TemplateDecls();

  return result;
}